

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcToken * __thiscall CTcPrsGramNodeCat::get_next_token(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNode *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  
  pCVar1 = this->cur_sub_->next_;
  this->cur_sub_ = pCVar1;
  if (pCVar1 != (CTcPrsGramNode *)0x0) {
    iVar2 = (*(pCVar1->super_CTcTokenSource)._vptr_CTcTokenSource[7])();
    return (CTcToken *)CONCAT44(extraout_var,iVar2);
  }
  return (CTcToken *)0x0;
}

Assistant:

const CTcToken *get_next_token()
    {
        /* advance to the next subitem */
        cur_sub_ = cur_sub_->next_;
        
        /* 
         *   If there's anything left, return it; otherwise, return null.
         *   During final token expansion, a 'cat' node never has anything
         *   but tokens beneath it, since we move all the 'or' nodes to a
         *   single 'or' at the top of the tree and flatten out the 'cat'
         *   nodes to a single level under that; so, we can simply return
         *   the token directly from the next underlying node.  
         */
        return (cur_sub_ != 0 ? cur_sub_->get_tok() : 0);
    }